

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void http_buf_pull_up(nni_http_conn *conn)

{
  nni_http_conn *conn_local;
  
  if (conn->rd_get != 0) {
    memmove(conn->buf,conn->buf + conn->rd_get,conn->rd_put - conn->rd_get);
    conn->rd_put = conn->rd_put - conn->rd_get;
    conn->rd_get = 0;
  }
  return;
}

Assistant:

static void
http_buf_pull_up(nni_http_conn *conn)
{
	if (conn->rd_get != 0) {
		memmove(conn->buf, conn->buf + conn->rd_get,
		    conn->rd_put - conn->rd_get);
		conn->rd_put -= conn->rd_get;
		conn->rd_get = 0;
	}
}